

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall deqp::egl::GLES2ThreadTest::CreateProgram::exec(CreateProgram *this,Thread *t)

{
  ostream *poVar1;
  GLuint GVar2;
  deUint32 err;
  Thread *pTVar3;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"Begin -- glCreateProgram()",0x1a);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    GVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x3c8))();
    err = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"glCreateProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x5df);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = glCreateProgram()",0x14);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    ((this->m_program).m_ptr)->program = GVar2;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void CreateProgram::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint program = 0;

	thread.newMessage() << "Begin -- glCreateProgram()" << tcu::ThreadUtil::Message::End;
	program = thread.gl.createProgram();
	GLU_CHECK_GLW_MSG(thread.gl, "glCreateProgram()");
	thread.newMessage() << "End -- " << program  << " = glCreateProgram()" << tcu::ThreadUtil::Message::End;

	m_program->program	= program;
}